

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O0

Slice * __thiscall leveldb::Slice::ToString_abi_cxx11_(Slice *this)

{
  char *pcVar1;
  ulong uVar2;
  undefined8 *in_RSI;
  allocator local_19 [9];
  Slice *this_local;
  
  pcVar1 = (char *)*in_RSI;
  uVar2 = in_RSI[1];
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,uVar2,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return this;
}

Assistant:

std::string ToString() const { return std::string(data_, size_); }